

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

_AL_LIST * list_do_create(size_t capacity,size_t extra_item_size)

{
  _Bool _Var1;
  _AL_LIST *list_00;
  _AL_LIST_ITEM *p_Var2;
  long in_RSI;
  size_t in_RDI;
  _AL_LIST_ITEM *prev;
  _AL_LIST_ITEM *item;
  _AL_LIST *list;
  uint8_t *memory_ptr;
  size_t memory_size;
  size_t i;
  _AL_LIST_ITEM *p_Var3;
  _AL_LIST *local_30;
  ulong local_20;
  char *in_stack_fffffffffffffff8;
  
  list_00 = (_AL_LIST *)al_malloc_with_context(0,0,(char *)0x0,(char *)0x1fd184);
  if (list_00 == (_AL_LIST *)0x0) {
    _Var1 = _al_trace_prefix((char *)memory_ptr,list._4_4_,(char *)item,prev._4_4_,
                             in_stack_fffffffffffffff8);
    if (_Var1) {
      _al_trace_suffix("Out of memory.");
    }
    list_00 = (_AL_LIST *)0x0;
  }
  else {
    local_30 = list_00 + 1;
    list_00->size = 0;
    list_00->capacity = in_RDI;
    list_00->item_size = 0x28;
    list_00->item_size_with_extra = in_RSI + 0x28;
    list_00->next_free = (_AL_LIST_ITEM *)local_30;
    list_00->user_data = (void *)0x0;
    list_00->dtor = (_AL_LIST_DTOR)0x0;
    p_Var2 = (_AL_LIST_ITEM *)0x0;
    p_Var3 = list_00->next_free;
    for (local_20 = 0; local_20 <= list_00->capacity; local_20 = local_20 + 1) {
      local_30 = (_AL_LIST *)((long)&local_30->root + list_00->item_size_with_extra);
      p_Var3->list = list_00;
      p_Var3->next = (_AL_LIST_ITEM *)local_30;
      p_Var2 = p_Var3;
      p_Var3 = p_Var3->next;
    }
    p_Var2->next = (_AL_LIST_ITEM *)0x0;
    p_Var2 = list_get_free_item(list_00);
    list_00->root = p_Var2;
    list_00->root->dtor = (_AL_LIST_ITEM_DTOR)0x0;
    list_00->root->next = list_00->root;
    list_00->root->prev = list_00->root;
  }
  return list_00;
}

Assistant:

static _AL_LIST* list_do_create(size_t capacity, size_t extra_item_size)
{
   size_t i;
   size_t memory_size;
   uint8_t* memory_ptr;
   _AL_LIST* list = NULL;
   _AL_LIST_ITEM* item = NULL;
   _AL_LIST_ITEM* prev = NULL;


   /* Calculate amount of memory needed for the list.
    * Always at least one element is allocated together with list,
    * which is intended to be a root.
    */
   memory_size = sizeof(_AL_LIST) + (capacity + 1) * (sizeof(_AL_LIST_ITEM) + extra_item_size);

   memory_ptr = (uint8_t*)al_malloc(memory_size);
   if (NULL == memory_ptr) {
      ALLEGRO_ERROR("Out of memory.");
      return NULL;
   }

   list                       = (_AL_LIST*)memory_ptr;
   memory_ptr                += sizeof(_AL_LIST);
   list->size                 = 0;
   list->capacity             = capacity;
   list->item_size            = sizeof(_AL_LIST_ITEM);
   list->item_size_with_extra = sizeof(_AL_LIST_ITEM) + extra_item_size;
   list->next_free            = (_AL_LIST_ITEM*)memory_ptr;
   list->user_data            = NULL;
   list->dtor                 = NULL;

   /* Initialize free item list.
    */
   prev = NULL;
   item = list->next_free;
   for (i = 0; i <= list->capacity; ++i) {

      memory_ptr += list->item_size_with_extra;
      item->list  = list;
      item->next  = (_AL_LIST_ITEM*)memory_ptr;
      prev        = item;
      item        = item->next;
   }

   /* Set proper free list tail value. */
   prev->next = NULL;

   /* Initialize root. */
   list->root = list_get_free_item(list);
   list->root->dtor = NULL;
   list->root->next = list->root;
   list->root->prev = list->root;

   return list;
}